

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O2

ZyanStatus
ZydisDecoderDecodeInstruction
          (ZydisDecoder *decoder,ZydisDecoderContext *context,void *buffer,ZyanUSize length,
          ZydisDecodedInstruction *instruction)

{
  byte bVar1;
  undefined7 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  byte bVar6;
  ZyanStatus ZVar7;
  ZyanU8 ZVar8;
  uint uVar9;
  ulong uVar10;
  ZydisDecoderContext *pZVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  ZydisDecodedInstruction *pZVar15;
  ulong uVar16;
  ZydisMachineMode ZVar17;
  ZyanUSize ZVar18;
  ZyanU8 *pZVar19;
  bool bVar20;
  byte local_d2;
  byte local_d1;
  byte local_d0;
  byte local_cf;
  ZyanBool local_ce;
  byte local_cd;
  byte local_cc;
  byte local_cb;
  byte local_ca;
  byte local_c9;
  uint local_c8;
  uint local_c4;
  ZydisDecoderState local_c0;
  uint local_8c;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ZydisDecoderContext *local_58;
  ZydisDecoderContext default_context;
  
  ZVar7 = 0x80100004;
  if (((buffer != (void *)0x0) && (decoder != (ZydisDecoder *)0x0)) &&
     (instruction != (ZydisDecodedInstruction *)0x0)) {
    if (length == 0) {
      ZVar7 = 0x80200000;
    }
    else {
      local_c0.prefixes.has_lock = '\0';
      local_c0.prefixes.group1 = '\0';
      local_c0.prefixes.group2 = '\0';
      local_c0.prefixes.effective_segment = '\0';
      local_c0.prefixes.mandatory_candidate = '\0';
      local_c0.prefixes.offset_lock = '\0';
      local_c0.prefixes.offset_group1 = '\0';
      local_c0.prefixes.offset_group2 = '\0';
      local_c0.context = context;
      if (context == (ZydisDecoderContext *)0x0) {
        local_c0.context = &default_context;
      }
      local_c0.prefixes.offset_osz_override = '\0';
      local_c0.prefixes.offset_asz_override = '\0';
      local_c0.prefixes.offset_segment = '\0';
      local_c0.prefixes.offset_mandatory = '\0';
      local_c0.prefixes.offset_notrack = -1;
      local_c0._45_3_ = 0;
      *(undefined8 *)&((local_c0.context)->vector_unified).R2 = 0;
      *(undefined8 *)&((local_c0.context)->reg_info).id_base = 0;
      (local_c0.context)->definition = (void *)0x0;
      (local_c0.context)->eosz_index = '\0';
      (local_c0.context)->easz_index = '\0';
      ((local_c0.context)->vector_unified).W = '\0';
      ((local_c0.context)->vector_unified).R = '\0';
      ((local_c0.context)->vector_unified).X = '\0';
      ((local_c0.context)->vector_unified).B = '\0';
      ((local_c0.context)->vector_unified).L = '\0';
      ((local_c0.context)->vector_unified).LL = '\0';
      local_80 = 0;
      pZVar15 = instruction;
      local_c0.decoder = decoder;
      local_c0.buffer = (ZyanU8 *)buffer;
      local_c0.buffer_len = length;
      local_58 = context;
      memset(instruction,0,0x148);
      uVar3 = local_c0._40_8_;
      instruction->machine_mode = decoder->machine_mode;
      instruction->stack_width = (ZyanU8)(0x10 << ((char)decoder->stack_width & 0x1f));
      local_cf = local_c0.prefixes.offset_asz_override;
      local_d0 = local_c0.prefixes.offset_osz_override;
      local_c8 = (uint)local_c0.prefixes.mandatory_candidate;
      local_c4 = (uint)local_c0.prefixes.offset_mandatory;
      local_d2 = local_c0.prefixes.group2;
      local_d1 = local_c0.prefixes.offset_group2;
      local_ca = local_c0.prefixes.effective_segment;
      local_c9 = local_c0.prefixes.offset_segment;
      uVar16 = (ulong)local_c0._40_8_ >> 0x20 & 0xff;
      local_cc = local_c0.prefixes.group1;
      local_cb = local_c0.prefixes.offset_group1;
      local_ce = local_c0.prefixes.has_lock;
      local_cd = local_c0.prefixes.offset_lock;
      local_78 = 0;
      local_68 = 0;
      local_70 = 0;
      local_88 = 0;
      local_60 = 0;
      local_8c = 0;
      uVar14 = 0;
      uVar12 = 0;
      ZVar18 = length;
      pZVar19 = (ZyanU8 *)buffer;
      while( true ) {
        bVar6 = (byte)uVar12;
        if (0xe < bVar6) break;
        if (length == uVar12) {
          return 0x80200000;
        }
        bVar1 = *(byte *)((long)buffer + uVar12);
        pZVar15 = (ZydisDecodedInstruction *)CONCAT71((int7)((ulong)pZVar15 >> 8),bVar1);
        uVar9 = bVar1 - 0x26;
        bVar13 = (byte)uVar14;
        if (uVar9 < 0x40) {
          if ((0x1010101UL >> ((ulong)uVar9 & 0x3f) & 1) == 0) {
            if ((0xc000000000000000U >> ((ulong)uVar9 & 0x3f) & 1) == 0) goto LAB_0010e8d1;
          }
          else if (decoder->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
            uVar10 = uVar16 & 0xff;
            uVar16 = uVar12 & 0xffffffff;
            if (((byte)local_60 & 0xfe) == 100) {
              uVar16 = uVar10;
            }
            if (bVar1 != 0x3e) {
              uVar16 = uVar10;
            }
            local_80 = uVar12 & 0xffffffff;
            local_78 = (ulong)pZVar15 & 0xffffffff;
            local_d2 = bVar1;
            local_d1 = bVar6;
            goto LAB_0010e9a6;
          }
          uVar16 = 0xff;
          local_80 = (ulong)CONCAT31((int3)(uVar9 >> 8),bVar6);
          local_78 = (ulong)pZVar15 & 0xffffffff;
          local_60 = (ulong)pZVar15 & 0xffffffff;
          local_d2 = bVar1;
          local_d1 = bVar6;
          local_ca = bVar1;
          local_c9 = bVar6;
LAB_0010e9a6:
          if (bVar13 != bVar1 && bVar13 != 0) {
            bVar6 = 0;
            uVar14 = 0;
            goto LAB_0010e9bd;
          }
        }
        else {
LAB_0010e8d1:
          if (bVar1 - 0xf2 < 2) {
            local_c4 = (uint)uVar12 & 0xff;
            local_cc = bVar1;
            local_cb = bVar6;
            local_c8 = (uint)pZVar15;
            local_8c = (uint)pZVar15;
            goto LAB_0010e9a6;
          }
          if (bVar1 == 0x66) {
            bVar20 = (char)local_8c == '\0';
            local_c4 = local_c4 & 0xff;
            if (bVar20) {
              local_c4 = (uint)uVar12;
            }
            local_c8 = local_c8 & 0xff;
            if (bVar20) {
              local_c8 = 0x66;
            }
            local_8c = local_8c & 0xff;
            if (bVar20) {
              local_8c = 0x66;
            }
            local_88 = local_88 | 0x80000000000;
            instruction->attributes = local_88;
            local_70 = uVar12 & 0xff;
            local_d0 = bVar6;
            goto LAB_0010e9a6;
          }
          if (bVar1 == 0x67) {
            local_88 = local_88 | 0x100000000000;
            instruction->attributes = local_88;
            local_68 = uVar12 & 0xffffffff;
            local_cf = bVar6;
            goto LAB_0010e9a6;
          }
          if (bVar1 == 0xf0) {
            local_ce = '\x01';
            local_cd = bVar6;
            goto LAB_0010e9a6;
          }
          ZVar17 = decoder->machine_mode;
          if (((bVar1 & 0xf0) != 0x40) || (ZVar17 != ZYDIS_MACHINE_MODE_LONG_64)) {
            local_c0.prefixes.offset_asz_override = local_cf;
            local_c0.prefixes.offset_osz_override = local_d0;
            local_c0.prefixes._0_8_ = (ulong)(byte)local_c8 << 0x20;
            local_c0.prefixes._0_7_ = (uint7)CONCAT51(local_c0.prefixes._3_5_,local_d2) << 0x10;
            uVar2 = local_c0.prefixes._0_7_;
            local_c0.prefixes.offset_group2 = local_d1;
            local_c0.prefixes._0_3_ = SUB73(uVar2,0);
            local_c0.prefixes.effective_segment = local_ca;
            local_c0.prefixes.offset_segment = local_c9;
            local_c0.prefixes.offset_mandatory = (char)local_c4;
            uVar5 = local_c0.prefixes._8_4_;
            local_c0._45_3_ = SUB83(uVar3,5);
            local_c0.prefixes.offset_notrack = (ZyanI8)uVar16;
            local_c0.prefixes._0_6_ = (int6)CONCAT61(local_c0.prefixes._2_6_,local_cc) << 8;
            local_c0.prefixes.offset_group1 = local_cb;
            uVar3 = local_c0.prefixes._0_8_;
            local_c0.prefixes.has_lock = local_ce;
            uVar4 = local_c0.prefixes._0_8_;
            local_c0.prefixes._6_2_ = SUB82(uVar3,6);
            local_c0.prefixes._0_5_ = SUB85(uVar4,0);
            local_c0.prefixes.offset_lock = local_cd;
            if ((local_88 & 0x80000000000) != 0) {
              (instruction->raw).prefixes[local_70].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
            }
            if ((local_88 & 0x100000000000) != 0) {
              (instruction->raw).prefixes[local_68 & 0xff].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
            }
            if (bVar13 != 0) {
              (instruction->raw).prefixes[(instruction->raw).field_3.rex.offset].type =
                   ZYDIS_PREFIX_TYPE_EFFECTIVE;
              if ((bVar13 & 0xf0) != 0x40) {
                __assert_fail("(data & 0xF0) == 0x40",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                              ,0x17a,
                              "void ZydisDecodeREX(ZydisDecoderContext *, ZydisDecodedInstruction *, ZyanU8)"
                             );
              }
              bVar6 = (byte)(uVar14 >> 3) & 1;
              instruction->attributes = local_88 | 4;
              (instruction->raw).field_3.rex.W = bVar6;
              (instruction->raw).field_3.rex.R = (byte)(uVar14 >> 2) & 1;
              (instruction->raw).field_3.rex.X = (byte)(uVar14 >> 1) & 1;
              (instruction->raw).field_3.rex.B = bVar13 & 1;
              pZVar11 = &default_context;
              if (local_58 != (ZydisDecoderContext *)0x0) {
                pZVar11 = local_58;
              }
              (pZVar11->vector_unified).W = bVar6;
              (pZVar11->vector_unified).R = (instruction->raw).field_3.rex.R;
              (pZVar11->vector_unified).X = (instruction->raw).field_3.rex.X;
              (pZVar11->vector_unified).B = (instruction->raw).field_3.rex.B;
              ZVar17 = decoder->machine_mode;
            }
            if ((ZVar17 != ZYDIS_MACHINE_MODE_LONG_64) && ((char)local_78 == '>')) {
              local_c0.prefixes.offset_notrack = (ZyanI8)local_80;
              local_c0.prefixes._8_5_ = CONCAT14(local_c0.prefixes.offset_notrack,uVar5);
            }
            ZVar7 = ZydisDecodeInstruction(&local_c0,instruction);
            if ((int)ZVar7 < 0) {
              return ZVar7;
            }
            (instruction->raw).encoding2 = instruction->encoding;
            return 0x100000;
          }
          uVar14 = (ulong)pZVar15 & 0xffffffff;
LAB_0010e9bd:
          (instruction->raw).field_3.rex.offset = bVar6;
        }
        ZVar8 = (ZyanU8)(uVar12 + 1);
        (instruction->raw).prefix_count = ZVar8;
        (instruction->raw).prefixes[uVar12].value = bVar1;
        instruction->length = ZVar8;
        local_c0.buffer = pZVar19 + 1;
        local_c0.buffer_len = ZVar18 - 1;
        uVar12 = uVar12 + 1;
        ZVar18 = local_c0.buffer_len;
        pZVar19 = local_c0.buffer;
      }
      ZVar7 = 0x80200002;
    }
  }
  return ZVar7;
}

Assistant:

ZyanStatus ZydisDecoderDecodeInstruction(const ZydisDecoder* decoder, ZydisDecoderContext* context,
    const void* buffer, ZyanUSize length, ZydisDecodedInstruction* instruction)
{
    if (!decoder || !instruction || !buffer)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (!length)
    {
        return ZYDIS_STATUS_NO_MORE_DATA;
    }

    ZydisDecoderState state;
    ZYAN_MEMSET(&state, 0, sizeof(state));
    state.decoder = decoder;
    state.buffer = (const ZyanU8*)buffer;
    state.buffer_len = length;
    state.prefixes.offset_notrack = -1;

    ZydisDecoderContext default_context;
    if (!context)
    {
        // Use a fallback context if no custom one has been provided
        context = &default_context;
    }
    ZYAN_MEMSET(context, 0, sizeof(*context));
    state.context = context;

    ZYAN_MEMSET(instruction, 0, sizeof(*instruction));
    instruction->machine_mode = decoder->machine_mode;
    instruction->stack_width = 16 << decoder->stack_width;

    ZYAN_CHECK(ZydisCollectOptionalPrefixes(&state, instruction));
    ZYAN_CHECK(ZydisDecodeInstruction(&state, instruction));

    instruction->raw.encoding2 = instruction->encoding;

    return ZYAN_STATUS_SUCCESS;
}